

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildStartCall(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *dstOpnd_00;
  IntConstOpnd *src1Opnd;
  IntConstOpnd *srcOpnd;
  IntConstType value;
  RegOpnd *dstOpnd;
  Instr *instr;
  OpLayoutStartCall *pOStack_20;
  ArgSlot ArgCount;
  OpLayoutStartCall *regLayout;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  regLayout._0_4_ = offset;
  regLayout._6_2_ = newOpcode;
  _offset_local = this;
  if (newOpcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x17e2,"(newOpcode == Js::OpCode::StartCall)",
                       "newOpcode == Js::OpCode::StartCall");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pOStack_20 = Js::ByteCodeReader::StartCall(&this->m_jnReader);
  instr._6_2_ = pOStack_20->ArgCount;
  dstOpnd_00 = IR::RegOpnd::New(TyVar,this->m_func);
  this->m_callsOnStack = this->m_callsOnStack + 1;
  src1Opnd = IR::IntConstOpnd::New((ulong)instr._6_2_,TyInt32,this->m_func,false);
  dstOpnd = (RegOpnd *)
            IR::Instr::New(regLayout._6_2_,&dstOpnd_00->super_Opnd,&src1Opnd->super_Opnd,
                           this->m_func);
  AddInstr(this,(Instr *)dstOpnd,(uint32)regLayout);
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Push(this->m_argStack,(Instr **)&dstOpnd);
  return;
}

Assistant:

void
IRBuilder::BuildStartCall(Js::OpCode newOpcode, uint32 offset)
{
    Assert(newOpcode == Js::OpCode::StartCall);

    const unaligned Js::OpLayoutStartCall * regLayout = m_jnReader.StartCall();
    Js::ArgSlot ArgCount = regLayout->ArgCount;

    IR::Instr *     instr;
    IR::RegOpnd *   dstOpnd;

    // Dst of StartCall is always r0...  Let's give it a new dst such that it can
    // be singleDef.

    dstOpnd = IR::RegOpnd::New(TyVar, m_func);

#if DBG
    m_callsOnStack++;
#endif

    IntConstType    value = ArgCount;
    IR::IntConstOpnd * srcOpnd;

    srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);

    this->AddInstr(instr, offset);

    // Keep a stack of arg instructions such that we can link them up once we see
    // the call that consumes them.

    m_argStack->Push(instr);
}